

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

Info * __thiscall EOPlus::Parser::ParseMain(Info *__return_storage_ptr__,Parser *this)

{
  variant *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 extraout_RAX;
  runtime_error *prVar7;
  long *plVar8;
  size_type *psVar9;
  Token *t_00;
  int iVar10;
  Token t;
  string local_1a0;
  uint local_180;
  uint local_17c;
  undefined1 local_178 [24];
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  bool local_140;
  bool bStack_13f;
  bool bStack_13e;
  bool bStack_13d;
  bool bStack_13c;
  undefined3 uStack_13b;
  var_type local_138;
  int local_130;
  uint *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  string local_e0;
  variant local_c0;
  Token local_80;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->version = 0;
  __return_storage_ptr__->hidden = NotHidden;
  __return_storage_ptr__->disabled = false;
  util::variant::variant(&local_c0);
  local_178._0_4_ = Invalid;
  local_178._8_4_ = local_c0.val_int;
  local_178._12_4_ = local_c0._4_4_;
  local_178._16_4_ = local_c0.val_float._0_4_;
  local_178._20_4_ = local_c0.val_float._4_4_;
  local_160._M_p = (pointer)&local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_c0.val_string._M_dataplus._M_p,
             local_c0.val_string._M_dataplus._M_p + local_c0.val_string._M_string_length);
  local_138 = local_c0.type;
  local_140 = local_c0.val_bool;
  bStack_13f = local_c0.cache_val[0];
  bStack_13e = local_c0.cache_val[1];
  bStack_13d = local_c0.cache_val[2];
  bStack_13c = local_c0.cache_val[3];
  uStack_13b = local_c0._53_3_;
  local_130 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val_string._M_dataplus._M_p != &local_c0.val_string.field_2) {
    operator_delete(local_c0.val_string._M_dataplus._M_p,
                    local_c0.val_string.field_2._M_allocated_capacity + 1);
  }
  local_128 = &__return_storage_ptr__->version;
  this_00 = (variant *)(local_178 + 8);
  paVar1 = &local_1a0.field_2;
  local_180 = 0;
  local_17c = 0;
  do {
    while( true ) {
      bVar3 = GetToken(this,(Token *)local_178,0x41);
      if (!bVar3) goto LAB_00141a84;
      if (local_178._0_4_ != Identifier) break;
      util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
      iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (iVar5 == 0) {
        if ((local_180 & 1) != 0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
          local_1a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a0,"Main-block can only contain one questname.","");
          pPVar2 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          iVar5 = pPVar2->line;
          iVar10 = pPVar2->reject_line;
          std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
          if (iVar10 < iVar5) {
            iVar10 = iVar5;
          }
          *(int *)(prVar7 + 0x10) = iVar10;
          *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
          __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
        }
        ParseQuestName_abi_cxx11_(&local_1a0,this);
        uVar6 = std::__cxx11::string::operator=
                          ((string *)__return_storage_ptr__,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          uVar6 = extraout_RAX;
        }
        local_180 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
      else {
        util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
        iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (iVar5 == 0) {
          if ((local_17c & 1) != 0) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
            local_1a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"Main-block can only contain one version.","");
            pPVar2 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar5 = pPVar2->line;
            iVar10 = pPVar2->reject_line;
            std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
            if (iVar10 < iVar5) {
              iVar10 = iVar5;
            }
            *(int *)(prVar7 + 0x10) = iVar10;
            *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
            __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar4 = ParseVersion(this);
          *local_128 = uVar4;
          local_17c = (uint)CONCAT71((uint7)(uint3)(uVar4 >> 8),1);
        }
        else {
          util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
          iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 == 0) {
            if (__return_storage_ptr__->hidden != NotHidden) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
              local_1a0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"Main-block can only contain one hidden attribute.",""
                        );
              pPVar2 = (this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                       _M_head_impl;
              iVar5 = pPVar2->line;
              iVar10 = pPVar2->reject_line;
              std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
              if (iVar10 < iVar5) {
                iVar10 = iVar5;
              }
              *(int *)(prVar7 + 0x10) = iVar10;
              *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
              __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
            }
            __return_storage_ptr__->hidden = Hidden;
          }
          else {
            util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
            iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (iVar5 == 0) {
              if (__return_storage_ptr__->hidden != NotHidden) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
                local_1a0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a0,"Main-block can only contain one hidden attribute.",
                           "");
                pPVar2 = (this->tok)._M_t.
                         super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                         _M_head_impl;
                iVar5 = pPVar2->line;
                iVar10 = pPVar2->reject_line;
                std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
                if (iVar10 < iVar5) {
                  iVar10 = iVar5;
                }
                *(int *)(prVar7 + 0x10) = iVar10;
                *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
                __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
              }
              __return_storage_ptr__->hidden = HiddenEnd;
            }
            else {
              util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
              iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != paVar1) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if (iVar5 != 0) goto LAB_00141a84;
              if (__return_storage_ptr__->disabled == true) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
                local_1a0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1a0,
                           "Main-block can only contain one disabled attribute.","");
                pPVar2 = (this->tok)._M_t.
                         super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                         .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                         _M_head_impl;
                iVar5 = pPVar2->line;
                iVar10 = pPVar2->reject_line;
                std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
                if (iVar10 < iVar5) {
                  iVar10 = iVar5;
                }
                *(int *)(prVar7 + 0x10) = iVar10;
                *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
                __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
              }
              __return_storage_ptr__->disabled = true;
            }
          }
        }
      }
    }
  } while (local_178._0_4_ != Symbol);
  util::variant::GetString_abi_cxx11_(&local_1a0,this_00);
  iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
LAB_00141a84:
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace \'}\'."
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)local_100);
  local_120._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar9) {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120.field_2._8_8_ = plVar8[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar9;
  }
  local_120._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Parser_Token_Server_Base::RejectToken
            (&local_80,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
  token_got_string_abi_cxx11_(&local_e0,(EOPlus *)&local_80,t_00);
  std::operator+(&local_1a0,&local_120,&local_e0);
  pPVar2 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  local_180 = pPVar2->line;
  uVar4 = pPVar2->reject_line;
  std::runtime_error::runtime_error(prVar7,(string *)&local_1a0);
  if ((int)uVar4 < (int)local_180) {
    uVar4 = local_180;
  }
  *(uint *)(prVar7 + 0x10) = uVar4;
  *(undefined ***)prVar7 = &PTR__runtime_error_001d37c8;
  __cxa_throw(prVar7,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Info Parser::ParseMain()
	{
		bool has_questname = false;
		bool has_version = false;
		Info info;
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "questname")
				{
					if (has_questname)
						PARSER_ERROR("Main-block can only contain one questname.");

					has_questname = true;
					info.name = ParseQuestName();
				}
				else if (std::string(t.data) == "version")
				{
					if (has_version)
						PARSER_ERROR("Main-block can only contain one version.");

					has_version = true;
					info.version = ParseVersion();
				}
				else if (std::string(t.data) == "hidden")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::Hidden;
				}
				else if (std::string(t.data) == "hidden_end")
				{
					if (info.hidden != Info::NotHidden)
						PARSER_ERROR("Main-block can only contain one hidden attribute.");

					info.hidden = Info::HiddenEnd;
				}
				else if (std::string(t.data) == "disabled")
				{
					if (info.disabled)
						PARSER_ERROR("Main-block can only contain one disabled attribute.");

					info.disabled = true;
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
					return info;
				else
					break;
			}
		}

		PARSER_ERROR_GOT("Expected main-block entry (questname/version/hidden/hidden_end/disabled) or closing brace '}'.");
	}